

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_s3_1x39_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  mfcc_t *pmVar5;
  mfcc_t *pmVar6;
  int local_64;
  int32 i;
  mfcc_t d2;
  mfcc_t d1;
  mfcc_t *_w_1;
  mfcc_t *_w1;
  mfcc_t *w_1;
  mfcc_t *w1;
  mfcc_t *_w;
  mfcc_t *w;
  mfcc_t *f;
  mfcc_t **feat_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f0,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->cepsize != 0xd) {
    __assert_fail("feat_cepsize(fcb) == 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f1,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 1) {
    __assert_fail("feat_n_stream(fcb) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x1f2,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (*fcb->stream_len == 0x27) {
    if (fcb->window_size == 3) {
      memcpy(*feat,*mfc + 1,(long)(fcb->cepsize + -1) << 2);
      pmVar6 = *feat;
      iVar1 = fcb->cepsize;
      pmVar2 = mfc[2];
      pmVar3 = mfc[-2];
      for (local_64 = 0; local_64 < fcb->cepsize + -1; local_64 = local_64 + 1) {
        pmVar6[(long)iVar1 + (long)local_64 + -1] =
             (mfcc_t)((float)pmVar2[(long)local_64 + 1] - (float)pmVar3[(long)local_64 + 1]);
      }
      pmVar6 = pmVar6 + (long)iVar1 + (long)(fcb->cepsize + -1) + -1;
      *pmVar6 = **mfc;
      pmVar6[1] = (mfcc_t)((float)*mfc[2] - (float)*mfc[-2]);
      pmVar6[2] = (mfcc_t)(((float)*mfc[3] - (float)*mfc[-1]) - ((float)*mfc[1] - (float)*mfc[-3]));
      pmVar2 = mfc[3];
      pmVar3 = mfc[-1];
      pmVar4 = mfc[1];
      pmVar5 = mfc[-3];
      for (local_64 = 0; local_64 < fcb->cepsize + -1; local_64 = local_64 + 1) {
        pmVar6[(long)local_64 + 3] =
             (mfcc_t)(((float)pmVar2[(long)local_64 + 1] - (float)pmVar3[(long)local_64 + 1]) -
                     ((float)pmVar4[(long)local_64 + 1] - (float)pmVar5[(long)local_64 + 1]));
      }
      return;
    }
    __assert_fail("feat_window_size(fcb) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,500,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  __assert_fail("feat_stream_len(fcb, 0) == 39",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,499,"void feat_s3_1x39_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s3_1x39_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i;

    assert(fcb);
    assert(feat_cepsize(fcb) == 13);
    assert(feat_n_stream(fcb) == 1);
    assert(feat_stream_len(fcb, 0) == 39);
    assert(feat_window_size(fcb) == 3);

    /* CEP; skip C0 */
    memcpy(feat[0], mfc[0] + 1, (feat_cepsize(fcb) - 1) * sizeof(mfcc_t));
    /*
     * DCEP: mfc[2] - mfc[-2];
     */
    f = feat[0] + feat_cepsize(fcb) - 1;
    w = mfc[2] + 1;             /* +1 to skip C0 */
    _w = mfc[-2] + 1;

    for (i = 0; i < feat_cepsize(fcb) - 1; i++)
        f[i] = w[i] - _w[i];

    /* POW: C0, DC0, D2C0 */
    f += feat_cepsize(fcb) - 1;

    f[0] = mfc[0][0];
    f[1] = mfc[2][0] - mfc[-2][0];

    d1 = mfc[3][0] - mfc[-1][0];
    d2 = mfc[1][0] - mfc[-3][0];
    f[2] = d1 - d2;

    /* D2CEP: (mfc[3] - mfc[-1]) - (mfc[1] - mfc[-3]) */
    f += 3;

    w1 = mfc[3] + 1;            /* Final +1 to skip C0 */
    _w1 = mfc[-1] + 1;
    w_1 = mfc[1] + 1;
    _w_1 = mfc[-3] + 1;

    for (i = 0; i < feat_cepsize(fcb) - 1; i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }
}